

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

void __thiscall DbCheckPostLower::EnsureValidEndBoundary(DbCheckPostLower *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  BranchInstr *this_00;
  LabelInstr *pLVar5;
  bool local_29;
  Instr *instr_local;
  DbCheckPostLower *this_local;
  
  bVar2 = IsEndBoundary(this,instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x12e,"(IsEndBoundary(instr))",
                       "Nested helper call. Not a valid end boundary.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar3 = IR::Instr::GetKind(instr);
  local_29 = true;
  if (IVar3 != InstrKindLabel) {
    local_29 = IR::Instr::IsProfiledLabelInstr(instr);
  }
  if (local_29 != false) {
    pLVar5 = IR::Instr::AsLabelInstr(instr);
    pLVar5 = IR::Instr::GetNextNonEmptyLabel(&pLVar5->super_Instr);
    if (((byte)pLVar5->field_0x78 >> 1 & 1) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x132,"(false)","Nested helper call. Falling through a helper label.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  if (instr->m_opcode == JMP) {
    this_00 = IR::Instr::AsBranchInstr(instr);
    pLVar5 = IR::BranchInstr::GetTarget(this_00);
    pLVar5 = IR::Instr::GetNextNonEmptyLabel(&pLVar5->super_Instr);
    if (((byte)pLVar5->field_0x78 >> 1 & 1) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x138,"(false)","Nested helper call. Jumping to a helper label.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void
DbCheckPostLower::EnsureValidEndBoundary(IR::Instr *instr)
{
    AssertMsg(IsEndBoundary(instr), "Nested helper call. Not a valid end boundary.");
    if (instr->IsLabelInstr() && instr->AsLabelInstr()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Falling through a helper label.");
    }

    if (instr->m_opcode == Js::OpCode::JMP && instr->AsBranchInstr()->GetTarget()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Jumping to a helper label.");
    }
}